

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O2

string * __thiscall
cpptrace::microfmt::format<unsigned_int&,unsigned_long&>
          (string *__return_storage_ptr__,microfmt *this,char *fmt,uint *args,unsigned_long *args_1)

{
  array<cpptrace::microfmt::detail::format_value,_2UL> args_00;
  size_t sVar1;
  undefined8 uStack_48;
  undefined4 uStack_3c;
  undefined8 local_30;
  undefined4 uStack_24;
  
  sVar1 = strlen((char *)this);
  args_00._M_elems[0].field_0.int64_value._4_4_ = 0;
  args_00._M_elems[0].field_0.int64_value._0_4_ = *(uint *)fmt;
  args_00._M_elems[0]._20_4_ = uStack_3c;
  args_00._M_elems[0].value = 2;
  args_00._M_elems[1]._20_4_ = uStack_24;
  args_00._M_elems[1].value = 2;
  args_00._M_elems[0].field_0.string_view_value._M_str = (char *)uStack_48;
  args_00._M_elems[1].field_0.c_string_value = *(char **)args;
  args_00._M_elems[1].field_0.string_view_value._M_str = (char *)local_30;
  detail::format<2ul,char_const*>
            (__return_storage_ptr__,(detail *)this,(char *)(this + sVar1),*(char **)args,args_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, Args&&... args) {
        return detail::format<sizeof...(args)>(fmt, fmt + std::strlen(fmt), {detail::format_value(args)...});
    }